

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_starttls_resp(Curl_easy *data,int imapcode,imapstate instate)

{
  connectdata *conn;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  if ((data->conn->proto).ftpc.pp.overflow == 0) {
    if (imapcode == 1) {
      imap_state(data,IMAP_UPGRADETLS);
    }
    else if ((data->set).use_ssl == '\x01') {
      conn._4_4_ = imap_perform_authentication(data,data->conn);
    }
    else {
      Curl_failf(data,"STARTTLS denied");
      conn._4_4_ = CURLE_USE_SSL_FAILED;
    }
    data_local._4_4_ = conn._4_4_;
  }
  else {
    data_local._4_4_ = CURLE_WEIRD_SERVER_REPLY;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode imap_state_starttls_resp(struct Curl_easy *data,
                                         int imapcode,
                                         imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  (void)instate; /* no use for this yet */

  /* Pipelining in response is forbidden. */
  if(data->conn->proto.imapc.pp.overflow)
    return CURLE_WEIRD_SERVER_REPLY;

  if(imapcode != IMAP_RESP_OK) {
    if(data->set.use_ssl != CURLUSESSL_TRY) {
      failf(data, "STARTTLS denied");
      result = CURLE_USE_SSL_FAILED;
    }
    else
      result = imap_perform_authentication(data, conn);
  }
  else
    imap_state(data, IMAP_UPGRADETLS);

  return result;
}